

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawElementsBaseVertexTests.cpp
# Opt level: O3

string * __thiscall
glcts::DrawElementsBaseVertexTestBase::getFunctionName_abi_cxx11_
          (string *__return_storage_ptr__,DrawElementsBaseVertexTestBase *this,
          _function_type function_type)

{
  uint uVar1;
  char *pcVar2;
  TestError *this_00;
  char *pcVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"[?]","");
  switch(function_type) {
  case FUNCTION_GL_DRAW_ELEMENTS_BASE_VERTEX:
    uVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    pcVar3 = "glDrawElementsBaseVertex()";
    if ((uVar1 & 0x300) == 0) {
      pcVar3 = "glDrawElementsBaseVertexEXT()";
    }
    goto LAB_00ca2f0a;
  case FUNCTION_GL_DRAW_ELEMENTS_INSTANCED_BASE_VERTEX:
    uVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    pcVar3 = "glDrawElementsInstancedBaseVertex()";
    if ((uVar1 & 0x300) == 0) {
      pcVar3 = "glDrawElementsInstancedBaseVertexEXT()";
    }
    goto LAB_00ca2f0a;
  case FUNCTION_GL_DRAW_RANGE_ELEMENTS_BASE_VERTEX:
    uVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    pcVar2 = "glDrawRangeElementsBaseVertexEXT()";
    pcVar3 = "glDrawRangeElementsBaseVertex()";
    break;
  case FUNCTION_GL_MULTI_DRAW_ELEMENTS_BASE_VERTEX:
    uVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    pcVar2 = "glMultiDrawElementsBaseVertexEXT()";
    pcVar3 = "glMultiDrawElementsBaseVertex()";
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unknown function type",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/draw_elements_base_vertex/esextcDrawElementsBaseVertexTests.cpp"
               ,0x393);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  if ((uVar1 & 0x300) == 0) {
    pcVar3 = pcVar2;
  }
LAB_00ca2f0a:
  std::__cxx11::string::_M_replace
            ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
             (ulong)pcVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string DrawElementsBaseVertexTestBase::getFunctionName(_function_type function_type)
{
	std::string result = "[?]";

	switch (function_type)
	{
	case FUNCTION_GL_DRAW_ELEMENTS_BASE_VERTEX:
	{
		if (glu::isContextTypeES(m_context.getRenderContext().getType()))
		{
			result = "glDrawElementsBaseVertexEXT()";

			break;
		}
		else
		{
			result = "glDrawElementsBaseVertex()";

			break;
		}

		break;
	}

	case FUNCTION_GL_DRAW_ELEMENTS_INSTANCED_BASE_VERTEX:
	{
		if (glu::isContextTypeES(m_context.getRenderContext().getType()))
		{
			result = "glDrawElementsInstancedBaseVertexEXT()";

			break;
		}
		else
		{
			result = "glDrawElementsInstancedBaseVertex()";

			break;
		}

		break;
	}

	case FUNCTION_GL_DRAW_RANGE_ELEMENTS_BASE_VERTEX:
	{
		if (glu::isContextTypeES(m_context.getRenderContext().getType()))
		{
			result = "glDrawRangeElementsBaseVertexEXT()";

			break;
		}
		else
		{
			result = "glDrawRangeElementsBaseVertex()";

			break;
		}

		break;
	}

	case FUNCTION_GL_MULTI_DRAW_ELEMENTS_BASE_VERTEX:
	{
		if (glu::isContextTypeES(m_context.getRenderContext().getType()))
		{
			result = "glMultiDrawElementsBaseVertexEXT()";

			break;
		}
		else
		{
			result = "glMultiDrawElementsBaseVertex()";

			break;
		}

		break;
	}

	default:
	{
		TCU_FAIL("Unknown function type");

		break;
	}
	} /* switch (function_type) */

	return result;
}